

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generalizers.cpp
# Opt level: O3

bool selected_objs_replace_placeholder_proc(Am_Object *ph,Am_Value *new_value,Am_Object *sel_widget)

{
  bool bVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  
  pAVar2 = Am_Object::Get(ph,Am_PLACEHOLDER_INITIALIZED,1);
  bVar1 = Am_Value::Valid(pAVar2);
  if (bVar1) {
    pAVar2 = Am_Object::Get(ph,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
  }
  else {
    Am_Object::Set(ph,Am_PLACEHOLDER_INITIALIZED,true,0);
    pAVar2 = Am_Object::Get(sel_widget,0x169,0);
    Am_Value::operator=(new_value,pAVar2);
    if (am_sdebug == true) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"for placeholder ",0x10);
      poVar3 = operator<<((ostream *)&std::cout,ph);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," setting value to ",0x12);
      poVar3 = operator<<(poVar3,new_value);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      std::ostream::flush();
    }
    Am_Object::Set(ph,0x169,new_value,0);
  }
  return true;
}

Assistant:

Am_Define_Method(Am_Placeholder_Replace_Method, bool,
                 selected_objs_replace_placeholder,
                 (Am_Object & ph, Am_Value &new_value, Am_Object &sel_widget))
{
  if (ph.Peek(Am_PLACEHOLDER_INITIALIZED).Valid()) {
    new_value = ph.Get(Am_VALUE);
    return true;
  } else {
    ph.Set(Am_PLACEHOLDER_INITIALIZED, true);
    new_value = sel_widget.Get(Am_VALUE);
    if (am_sdebug)
      std::cout << "for placeholder " << ph << " setting value to " << new_value
                << std::endl
                << std::flush;
    ph.Set(Am_VALUE, new_value);
    return true;
  }
}